

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict unary_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  token_t ptVar1;
  size_t sVar2;
  node_t_conflict pnVar3;
  node_t_conflict pnVar4;
  undefined8 uVar5;
  char *pcVar6;
  node_code_t nc;
  pos_t pVar7;
  
  sVar2 = record_start(c2m_ctx);
  pnVar3 = par_type_name(c2m_ctx,1);
  record_stop(c2m_ctx,sVar2,(uint)(pnVar3 == &err_struct));
  ptVar1 = c2m_ctx->parse_ctx->curr_token;
  if (pnVar3 == &err_struct) {
    if (*(short *)ptVar1 == 0x132) {
      pcVar6 = (ptVar1->pos).fname;
      uVar5._0_4_ = (ptVar1->pos).lno;
      uVar5._4_4_ = (ptVar1->pos).ln_pos;
      read_token(c2m_ctx);
      sVar2 = record_start(c2m_ctx);
      pnVar3 = par_type_name(c2m_ctx,1);
      record_stop(c2m_ctx,sVar2,(uint)(pnVar3 == &err_struct));
      if (pnVar3 != &err_struct) {
        nc = N_SIZEOF;
        goto LAB_00198a47;
      }
      nc = N_EXPR_SIZEOF;
    }
    else {
      ptVar1 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar1 == 0x112) {
        pcVar6 = (ptVar1->pos).fname;
        uVar5._0_4_ = (ptVar1->pos).lno;
        uVar5._4_4_ = (ptVar1->pos).ln_pos;
        read_token(c2m_ctx);
        sVar2 = record_start(c2m_ctx);
        pnVar3 = par_type_name(c2m_ctx,1);
        record_stop(c2m_ctx,sVar2,(uint)(pnVar3 == &err_struct));
        if (pnVar3 == &err_struct) {
          pnVar3 = unary_expr(c2m_ctx,no_err_p);
          if (pnVar3 == &err_struct) goto LAB_00198a5a;
          pnVar3 = new_node(c2m_ctx,N_IGNORE);
          nc = N_ALIGNOF;
        }
        else {
          nc = N_ALIGNOF;
        }
        goto LAB_00198a47;
      }
      ptVar1 = c2m_ctx->parse_ctx->curr_token;
      if (*(short *)ptVar1 == 0x10c) {
        pcVar6 = (ptVar1->pos).fname;
        uVar5._0_4_ = (ptVar1->pos).lno;
        uVar5._4_4_ = (ptVar1->pos).ln_pos;
        nc = ptVar1->node_code;
        read_token(c2m_ctx);
      }
      else {
        ptVar1 = c2m_ctx->parse_ctx->curr_token;
        if (*(short *)ptVar1 == 0x10e) {
          pcVar6 = (ptVar1->pos).fname;
          uVar5._0_4_ = (ptVar1->pos).lno;
          uVar5._4_4_ = (ptVar1->pos).ln_pos;
          nc = ptVar1->node_code;
          read_token(c2m_ctx);
        }
        else {
          ptVar1 = c2m_ctx->parse_ctx->curr_token;
          if (*(short *)ptVar1 == 0x106) {
            pcVar6 = (ptVar1->pos).fname;
            uVar5._0_4_ = (ptVar1->pos).lno;
            uVar5._4_4_ = (ptVar1->pos).ln_pos;
            nc = ptVar1->node_code;
            read_token(c2m_ctx);
          }
          else {
            ptVar1 = c2m_ctx->parse_ctx->curr_token;
            if (*(short *)ptVar1 == 0x2a) {
              pcVar6 = (ptVar1->pos).fname;
              uVar5._0_4_ = (ptVar1->pos).lno;
              uVar5._4_4_ = (ptVar1->pos).ln_pos;
              nc = ptVar1->node_code;
              read_token(c2m_ctx);
            }
            else {
              ptVar1 = c2m_ctx->parse_ctx->curr_token;
              if (*(short *)ptVar1 != 0x26) {
                pnVar3 = post_expr(c2m_ctx,no_err_p);
                return pnVar3;
              }
              pcVar6 = (ptVar1->pos).fname;
              uVar5._0_4_ = (ptVar1->pos).lno;
              uVar5._4_4_ = (ptVar1->pos).ln_pos;
              nc = ptVar1->node_code;
              read_token(c2m_ctx);
            }
          }
        }
      }
      if (nc == N_MUL) {
        nc = N_DEREF;
      }
      else if (nc == N_AND) {
        nc = N_ADDR;
      }
    }
    pnVar3 = unary_expr(c2m_ctx,no_err_p);
    if (pnVar3 != &err_struct) {
LAB_00198a47:
      pVar7.lno = (int)uVar5;
      pVar7.ln_pos = (int)((ulong)uVar5 >> 0x20);
      pVar7.fname = pcVar6;
      pnVar3 = new_pos_node1(c2m_ctx,nc,pVar7,pnVar3);
      return pnVar3;
    }
  }
  else if (*(short *)ptVar1 == 0x7b) {
    pVar7 = ptVar1->pos;
    read_token(c2m_ctx);
    pnVar4 = initializer_list(c2m_ctx,no_err_p);
    if ((pnVar4 != &err_struct) && (*(short *)c2m_ctx->parse_ctx->curr_token == 0x7d)) {
      read_token(c2m_ctx);
      pnVar3 = new_node2(c2m_ctx,N_COMPOUND_LITERAL,pnVar3,pnVar4);
      add_pos(c2m_ctx,pnVar3,pVar7);
      pnVar3 = post_expr_part(c2m_ctx,no_err_p,pnVar3);
      return pnVar3;
    }
  }
  else {
    pnVar4 = unary_expr(c2m_ctx,no_err_p);
    if (pnVar4 != &err_struct) {
      pnVar3 = new_node2(c2m_ctx,N_CAST,pnVar3,pnVar4);
      return pnVar3;
    }
  }
LAB_00198a5a:
  return &err_struct;
}

Assistant:

D (unary_expr) {
  node_t r, t;
  node_code_t code;
  pos_t pos;

  if ((r = TRY (par_type_name)) != err_node) {
    t = r;
    if (!MP ('{', pos)) {
      P (unary_expr);
      r = new_node2 (c2m_ctx, N_CAST, t, r);
    } else {
      P (initializer_list);
      if (!M ('}')) return err_node;
      r = new_pos_node2 (c2m_ctx, N_COMPOUND_LITERAL, pos, t, r);
      PA (post_expr_part, r);
    }
    return r;
  } else if (MP (T_SIZEOF, pos)) {
    if ((r = TRY (par_type_name)) != err_node) {
      r = new_pos_node1 (c2m_ctx, N_SIZEOF, pos, r);
      return r;
    }
    code = N_EXPR_SIZEOF;
  } else if (MP (T_ALIGNOF, pos)) {
    if ((r = TRY (par_type_name)) != err_node) {
      r = new_pos_node1 (c2m_ctx, N_ALIGNOF, pos, r);
    } else {
      P (unary_expr); /* error recovery */
      r = new_pos_node1 (c2m_ctx, N_ALIGNOF, pos, new_node (c2m_ctx, N_IGNORE));
    }
    return r;
  } else if (!MC (T_INCDEC, pos, code) && !MC (T_UNOP, pos, code) && !MC (T_ADDOP, pos, code)
             && !MC ('*', pos, code) && !MC ('&', pos, code)) {
    P (post_expr);
    return r;
  } else if (code == N_AND) {
    code = N_ADDR;
  } else if (code == N_MUL) {
    code = N_DEREF;
  }
  P (unary_expr);
  r = new_pos_node1 (c2m_ctx, code, pos, r);
  return r;
}